

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_owner_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  wchar_t magic_test;
  archive_match *a;
  archive_entry *entry_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_id_excluded_ae");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if (entry == (archive_entry *)0x0) {
    archive_set_error(_a,0x16,"entry is NULL");
    _a_local._4_4_ = L'\xffffffe7';
  }
  else if ((_a[1].magic & 4) == 0) {
    _a_local._4_4_ = L'\0';
  }
  else {
    _a_local._4_4_ = owner_excluded((archive_match *)_a,entry);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_owner_excluded(struct archive *_a,
    struct archive_entry *entry)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_id_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	/* If we don't have inclusion id set at all, the entry is always
	 * not excluded. */
	if ((a->setflag & ID_IS_SET) == 0)
		return (0);
	return (owner_excluded(a, entry));
}